

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

size_t __thiscall
kj::_::BTreeImpl::verifyNode
          (BTreeImpl *this,size_t size,FunctionParam<bool_(unsigned_int,_unsigned_int)> *f,uint pos,
          uint height,MaybeUint maxRow)

{
  FunctionParam<bool_(unsigned_int,_unsigned_int)> *pFVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  size_t sVar6;
  ulong uVar7;
  Fault local_198;
  Fault f_6;
  undefined1 local_188 [8];
  DebugComparison<kj::_::BTreeImpl::MaybeUint_&,_kj::_::BTreeImpl::MaybeUint_&> _kjCondition_5;
  Fault f_5;
  DebugExpression<bool> _kjCondition_4;
  Fault f_4;
  undefined1 local_140 [8];
  DebugComparison<unsigned_int,_unsigned_long_&> _kjCondition_3;
  Iterator local_110;
  uint i_1;
  Iterator __end3_1;
  Iterator __begin3_1;
  Range<unsigned_int> *__range3_1;
  Leaf *pLStack_f0;
  uint n_1;
  Leaf *leaf;
  Fault f_3;
  DebugExpression<bool> _kjCondition_2;
  Fault f_2;
  DebugExpression<bool> _kjCondition_1;
  Fault local_b8;
  Fault f_1;
  undefined1 local_a8 [8];
  DebugComparison<unsigned_int,_unsigned_long_&> _kjCondition;
  Iterator local_78;
  uint i;
  Iterator __end3;
  Iterator __begin3;
  Range<unsigned_int> *__range3;
  size_t total;
  Parent *pPStack_50;
  uint n;
  Parent *parent;
  uint height_local;
  uint pos_local;
  FunctionParam<bool_(unsigned_int,_unsigned_int)> *f_local;
  size_t size_local;
  BTreeImpl *this_local;
  ulong uStack_20;
  MaybeUint maxRow_local;
  
  parent._0_4_ = height;
  parent._4_4_ = pos;
  _height_local = f;
  f_local = (FunctionParam<bool_(unsigned_int,_unsigned_int)> *)size;
  size_local = (size_t)this;
  this_local._4_4_ = maxRow.i;
  if (height == 0) {
    pLStack_f0 = (Leaf *)(this->tree + pos);
    __range3_1._4_4_ = Leaf::size(pLStack_f0);
    ___end3_1 = zeroTo<unsigned_int>(__range3_1._4_4_);
    i_1 = (uint)Range<unsigned_int>::begin((Range<unsigned_int> *)&__end3_1);
    local_110 = Range<unsigned_int>::end((Range<unsigned_int> *)&__end3_1);
    while (bVar2 = Range<unsigned_int>::Iterator::operator==((Iterator *)&i_1,&local_110),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      puVar5 = Range<unsigned_int>::Iterator::operator*((Iterator *)&i_1);
      _kjCondition_3._36_4_ = *puVar5;
      f_4.exception._0_4_ = MaybeUint::operator*(pLStack_f0->rows + (uint)_kjCondition_3._36_4_);
      f_4.exception._4_4_ =
           DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,(uint *)&f_4);
      DebugExpression<unsigned_int>::operator<
                ((DebugComparison<unsigned_int,_unsigned_long_&> *)local_140,
                 (DebugExpression<unsigned_int> *)((long)&f_4.exception + 4),
                 (unsigned_long *)&f_local);
      bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_140);
      pFVar1 = _height_local;
      if (!bVar2) {
        Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long&>&,unsigned_int&,unsigned_int&>
                  ((Fault *)&stack0xfffffffffffffeb0,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                   ,0xc2,FAILED,"*leaf.rows[i] < size","_kjCondition,n, i",
                   (DebugComparison<unsigned_int,_unsigned_long_&> *)local_140,
                   (uint *)((long)&__range3_1 + 4),(uint *)&_kjCondition_3.field_0x24);
        Debug::Fault::fatal((Fault *)&stack0xfffffffffffffeb0);
      }
      if (_kjCondition_3._36_4_ != 0) {
        uVar3 = MaybeUint::operator*(pLStack_f0->rows + (_kjCondition_3._36_4_ - 1));
        uVar4 = MaybeUint::operator*(pLStack_f0->rows + (uint)_kjCondition_3._36_4_);
        f_5.exception._6_1_ =
             FunctionParam<bool_(unsigned_int,_unsigned_int)>::operator()(pFVar1,uVar3,uVar4);
        f_5.exception._7_1_ =
             DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&_::MAGIC_ASSERT,(bool *)((long)&f_5.exception + 6))
        ;
        bVar2 = _::DebugExpression::operator_cast_to_bool
                          ((DebugExpression *)((long)&f_5.exception + 7));
        if (!bVar2) {
          Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,unsigned_int&,unsigned_int&,kj::_::BTreeImpl::MaybeUint&,kj::_::BTreeImpl::MaybeUint&>
                    ((Fault *)&_kjCondition_5.result,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                     ,0xc5,FAILED,"f(*leaf.rows[i - 1], *leaf.rows[i])",
                     "_kjCondition,n, i, leaf.rows[i - 1], leaf.rows[i]",
                     (DebugExpression<bool> *)((long)&f_5.exception + 7),
                     (uint *)((long)&__range3_1 + 4),(uint *)&_kjCondition_3.field_0x24,
                     pLStack_f0->rows + (_kjCondition_3._36_4_ - 1),
                     pLStack_f0->rows + (uint)_kjCondition_3._36_4_);
          Debug::Fault::fatal((Fault *)&_kjCondition_5.result);
        }
      }
      Range<unsigned_int>::Iterator::operator++((Iterator *)&i_1);
    }
    bVar2 = MaybeUint::operator==((MaybeUint *)((long)&this_local + 4),(void *)0x0);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      f_6.exception =
           (Exception *)
           DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&_::MAGIC_ASSERT,
                      pLStack_f0->rows + (__range3_1._4_4_ - 1));
      DebugExpression<kj::_::BTreeImpl::MaybeUint&>::operator==
                ((DebugComparison<kj::_::BTreeImpl::MaybeUint_&,_kj::_::BTreeImpl::MaybeUint_&> *)
                 local_188,(DebugExpression<kj::_::BTreeImpl::MaybeUint&> *)&f_6,
                 (MaybeUint *)((long)&this_local + 4));
      bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_188);
      if (!bVar2) {
        Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::BTreeImpl::MaybeUint&,kj::_::BTreeImpl::MaybeUint&>&,unsigned_int&>
                  (&local_198,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                   ,0xc9,FAILED,"leaf.rows[n-1] == maxRow","_kjCondition,n",
                   (DebugComparison<kj::_::BTreeImpl::MaybeUint_&,_kj::_::BTreeImpl::MaybeUint_&> *)
                   local_188,(uint *)((long)&__range3_1 + 4));
        Debug::Fault::fatal(&local_198);
      }
    }
    uStack_20 = (ulong)__range3_1._4_4_;
  }
  else {
    pPStack_50 = (Parent *)(this->tree + pos);
    total._4_4_ = Parent::keyCount(pPStack_50);
    __range3 = (Range<unsigned_int> *)0x0;
    ___end3 = zeroTo<unsigned_int>(total._4_4_);
    i = (uint)Range<unsigned_int>::begin((Range<unsigned_int> *)&__end3);
    local_78 = Range<unsigned_int>::end((Range<unsigned_int> *)&__end3);
    while (bVar2 = Range<unsigned_int>::Iterator::operator==((Iterator *)&i,&local_78),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      puVar5 = Range<unsigned_int>::Iterator::operator*((Iterator *)&i);
      _kjCondition._36_4_ = *puVar5;
      f_1.exception._0_4_ = MaybeUint::operator*(pPStack_50->keys + (uint)_kjCondition._36_4_);
      f_1.exception._4_4_ =
           DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,(uint *)&f_1);
      DebugExpression<unsigned_int>::operator<
                ((DebugComparison<unsigned_int,_unsigned_long_&> *)local_a8,
                 (DebugExpression<unsigned_int> *)((long)&f_1.exception + 4),
                 (unsigned_long *)&f_local);
      bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_a8);
      if (!bVar2) {
        Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long&>&,unsigned_int&,unsigned_int&>
                  (&local_b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                   ,0xb2,FAILED,"*parent.keys[i] < size","_kjCondition,n, i",
                   (DebugComparison<unsigned_int,_unsigned_long_&> *)local_a8,
                   (uint *)((long)&total + 4),(uint *)&_kjCondition.field_0x24);
        Debug::Fault::fatal(&local_b8);
      }
      sVar6 = verifyNode(this,(size_t)f_local,_height_local,
                         pPStack_50->children[(uint)_kjCondition._36_4_],(uint)parent - 1,
                         (MaybeUint)pPStack_50->keys[(uint)_kjCondition._36_4_].i);
      pFVar1 = _height_local;
      __range3 = (Range<unsigned_int> *)((long)&__range3->begin_ + sVar6);
      if (_kjCondition._36_4_ != 0) {
        uVar3 = MaybeUint::operator*(pPStack_50->keys + (_kjCondition._36_4_ - 1));
        uVar4 = MaybeUint::operator*(pPStack_50->keys + (uint)_kjCondition._36_4_);
        f_2.exception._6_1_ =
             FunctionParam<bool_(unsigned_int,_unsigned_int)>::operator()(pFVar1,uVar3,uVar4);
        f_2.exception._7_1_ =
             DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&_::MAGIC_ASSERT,(bool *)((long)&f_2.exception + 6))
        ;
        bVar2 = _::DebugExpression::operator_cast_to_bool
                          ((DebugExpression *)((long)&f_2.exception + 7));
        if (!bVar2) {
          Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,unsigned_int&,unsigned_int&,kj::_::BTreeImpl::MaybeUint&,kj::_::BTreeImpl::MaybeUint&>
                    ((Fault *)&stack0xffffffffffffff28,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                     ,0xb6,FAILED,"f(*parent.keys[i - 1], *parent.keys[i])",
                     "_kjCondition,n, i, parent.keys[i - 1], parent.keys[i]",
                     (DebugExpression<bool> *)((long)&f_2.exception + 7),(uint *)((long)&total + 4),
                     (uint *)&_kjCondition.field_0x24,pPStack_50->keys + (_kjCondition._36_4_ - 1),
                     pPStack_50->keys + (uint)_kjCondition._36_4_);
          Debug::Fault::fatal((Fault *)&stack0xffffffffffffff28);
        }
      }
      Range<unsigned_int>::Iterator::operator++((Iterator *)&i);
    }
    f_3.exception._4_4_ = this_local._4_4_;
    sVar6 = verifyNode(this,(size_t)f_local,_height_local,pPStack_50->children[total._4_4_],
                       (uint)parent - 1,this_local._4_4_);
    uVar7 = (long)&__range3->begin_ + sVar6;
    bVar2 = MaybeUint::operator==((MaybeUint *)((long)&this_local + 4),(void *)0x0);
    pFVar1 = _height_local;
    uStack_20 = uVar7;
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      uVar3 = MaybeUint::operator*(pPStack_50->keys + (total._4_4_ - 1));
      uVar4 = MaybeUint::operator*((MaybeUint *)((long)&this_local + 4));
      f_3.exception._2_1_ =
           FunctionParam<bool_(unsigned_int,_unsigned_int)>::operator()(pFVar1,uVar3,uVar4);
      f_3.exception._3_1_ =
           DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&_::MAGIC_ASSERT,(bool *)((long)&f_3.exception + 2));
      bVar2 = _::DebugExpression::operator_cast_to_bool
                        ((DebugExpression *)((long)&f_3.exception + 3));
      if (!bVar2) {
        Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,unsigned_int&,kj::_::BTreeImpl::MaybeUint&,kj::_::BTreeImpl::MaybeUint&>
                  ((Fault *)&leaf,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                   ,0xbb,FAILED,"f(*parent.keys[n-1], *maxRow)",
                   "_kjCondition,n, parent.keys[n-1], maxRow",
                   (DebugExpression<bool> *)((long)&f_3.exception + 3),(uint *)((long)&total + 4),
                   pPStack_50->keys + (total._4_4_ - 1),(MaybeUint *)((long)&this_local + 4));
        Debug::Fault::fatal((Fault *)&leaf);
      }
    }
  }
  return uStack_20;
}

Assistant:

size_t BTreeImpl::verifyNode(size_t size, FunctionParam<bool(uint, uint)>& f,
                             uint pos, uint height, MaybeUint maxRow) {
  if (height > 0) {
    auto& parent = tree[pos].parent;

    auto n = parent.keyCount();
    size_t total = 0;
    for (auto i: kj::zeroTo(n)) {
      KJ_ASSERT(*parent.keys[i] < size, n, i);
      total += verifyNode(size, f, parent.children[i], height - 1, parent.keys[i]);
      if (i > 0) {
        KJ_ASSERT(f(*parent.keys[i - 1], *parent.keys[i]),
            n, i, parent.keys[i - 1], parent.keys[i]);
      }
    }
    total += verifyNode(size, f, parent.children[n], height - 1, maxRow);
    if (maxRow != nullptr) {
      KJ_ASSERT(f(*parent.keys[n-1], *maxRow), n, parent.keys[n-1], maxRow);
    }
    return total;
  } else {
    auto& leaf = tree[pos].leaf;
    auto n = leaf.size();
    for (auto i: kj::zeroTo(n)) {
      KJ_ASSERT(*leaf.rows[i] < size, n, i);
      if (i > 0) {
        KJ_ASSERT(f(*leaf.rows[i - 1], *leaf.rows[i]),
            n, i, leaf.rows[i - 1], leaf.rows[i]);
      }
    }
    if (maxRow != nullptr) {
      KJ_ASSERT(leaf.rows[n-1] == maxRow, n);
    }
    return n;
  }
}